

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O3

float __thiscall nv::SincFilter::evaluate(SincFilter *this,float x)

{
  float fVar1;
  float __x;
  
  __x = x * 3.1415927;
  if (ABS(__x) < 0.0001) {
    return ((__x * __x) / 120.0 + -0.16666667) * __x * __x + 1.0;
  }
  fVar1 = sinf(__x);
  return fVar1 / __x;
}

Assistant:

float SincFilter::evaluate(float x) const
{
	return sincf(PI * x);
}